

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O3

bool tinyobj::ParseTextureNameAndOption(string *texname,texture_option_t *texopt,char *linebuf)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  undefined1 *extraout_RAX;
  undefined1 *puVar4;
  texture_type_t tVar5;
  byte bVar6;
  byte *pbVar7;
  byte *pbVar8;
  bool bVar9;
  string texture_name;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  ulong local_90;
  undefined1 *local_88;
  undefined8 local_80;
  undefined1 local_78 [16];
  texture_option_t *local_68;
  string *local_60;
  string *local_58;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = 0;
  local_60 = (string *)&texopt->colorspace;
  local_90 = 0;
  local_58 = texname;
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              if (((byte)*linebuf < 0xe) && ((0x2401U >> ((byte)*linebuf & 0x1f) & 1) != 0)) {
                bVar6 = (byte)local_90;
                if ((local_90 & 1) != 0) {
                  std::__cxx11::string::_M_assign((string *)local_58);
                }
                if (local_50 != local_40) {
                  operator_delete(local_50);
                }
                return (bool)(bVar6 & 1);
              }
              sVar2 = strspn(linebuf," \t");
              pbVar8 = (byte *)linebuf + sVar2;
              iVar1 = strncmp((char *)pbVar8,"-blendu",7);
              if ((iVar1 != 0) || ((pbVar8[7] != 0x20 && (pbVar8[7] != 9)))) break;
              sVar2 = strspn((char *)(pbVar8 + 8)," \t");
              pbVar7 = pbVar8 + sVar2 + 8;
              sVar3 = strcspn((char *)pbVar7," \t\r");
              bVar9 = true;
              if ((*pbVar7 == 0x6f) && (pbVar8[sVar2 + 9] == 0x66)) {
                bVar9 = pbVar8[sVar2 + 10] != 0x66;
              }
              linebuf = (char *)(pbVar7 + sVar3);
              texopt->blendu = bVar9;
            }
            iVar1 = strncmp((char *)pbVar8,"-blendv",7);
            if ((iVar1 != 0) || ((pbVar8[7] != 0x20 && (pbVar8[7] != 9)))) break;
            sVar2 = strspn((char *)(pbVar8 + 8)," \t");
            pbVar7 = pbVar8 + sVar2 + 8;
            sVar3 = strcspn((char *)pbVar7," \t\r");
            bVar9 = true;
            if ((*pbVar7 == 0x6f) && (pbVar8[sVar2 + 9] == 0x66)) {
              bVar9 = pbVar8[sVar2 + 10] != 0x66;
            }
            linebuf = (char *)(pbVar7 + sVar3);
            texopt->blendv = bVar9;
          }
          iVar1 = strncmp((char *)pbVar8,"-clamp",6);
          if ((iVar1 != 0) || ((pbVar8[6] != 0x20 && (pbVar8[6] != 9)))) break;
          sVar2 = strspn((char *)(pbVar8 + 7)," \t");
          pbVar7 = pbVar8 + sVar2 + 7;
          sVar3 = strcspn((char *)pbVar7," \t\r");
          bVar9 = true;
          if ((*pbVar7 == 0x6f) && (pbVar8[sVar2 + 8] == 0x66)) {
            bVar9 = pbVar8[sVar2 + 9] != 0x66;
          }
          linebuf = (char *)(pbVar7 + sVar3);
          texopt->clamp = bVar9;
        }
        iVar1 = strncmp((char *)pbVar8,"-boost",6);
        if ((iVar1 != 0) || ((pbVar8[6] != 0x20 && (pbVar8[6] != 9)))) break;
        sVar2 = strspn((char *)(pbVar8 + 7)," \t");
        pbVar8 = pbVar8 + sVar2 + 7;
        sVar2 = strcspn((char *)pbVar8," \t\r");
        linebuf = (char *)(pbVar8 + sVar2);
        local_b0[0] = (undefined1 *)0x3ff0000000000000;
        tryParseDouble((char *)pbVar8,linebuf,(double *)local_b0);
        texopt->sharpness = (float)(double)local_b0[0];
      }
      bVar6 = *pbVar8;
      if (bVar6 == 0x2d) break;
LAB_00108dcc:
      iVar1 = strncmp((char *)pbVar8,"-type",5);
      if ((iVar1 == 0) && ((pbVar8[5] == 0x20 || (pbVar8[5] == 9)))) {
        sVar2 = strspn((char *)(pbVar8 + 5)," \t");
        pbVar8 = pbVar8 + 5 + sVar2;
        sVar2 = strcspn((char *)pbVar8," \t\r");
        iVar1 = strncmp((char *)pbVar8,"cube_top",8);
        if (iVar1 == 0) {
          tVar5 = TEXTURE_TYPE_CUBE_TOP;
        }
        else {
          iVar1 = strncmp((char *)pbVar8,"cube_bottom",0xb);
          if (iVar1 == 0) {
            tVar5 = TEXTURE_TYPE_CUBE_BOTTOM;
          }
          else {
            iVar1 = strncmp((char *)pbVar8,"cube_left",9);
            if (iVar1 == 0) {
              tVar5 = TEXTURE_TYPE_CUBE_LEFT;
            }
            else {
              iVar1 = strncmp((char *)pbVar8,"cube_right",10);
              if (iVar1 == 0) {
                tVar5 = TEXTURE_TYPE_CUBE_RIGHT;
              }
              else {
                iVar1 = strncmp((char *)pbVar8,"cube_front",10);
                if (iVar1 == 0) {
                  tVar5 = TEXTURE_TYPE_CUBE_FRONT;
                }
                else {
                  iVar1 = strncmp((char *)pbVar8,"cube_back",9);
                  if (iVar1 == 0) {
                    tVar5 = TEXTURE_TYPE_CUBE_BACK;
                  }
                  else {
                    iVar1 = strncmp((char *)pbVar8,"sphere",6);
                    tVar5 = (texture_type_t)(iVar1 == 0);
                  }
                }
              }
            }
          }
        }
        linebuf = (char *)(pbVar8 + sVar2);
        texopt->type = tVar5;
      }
      else {
        iVar1 = strncmp((char *)pbVar8,"-imfchan",8);
        if ((iVar1 == 0) && ((pbVar8[8] == 0x20 || (pbVar8[8] == 9)))) {
          sVar2 = strspn((char *)(pbVar8 + 9)," \t");
          pbVar8 = pbVar8 + sVar2 + 9;
          sVar2 = strcspn((char *)pbVar8," \t\r");
          linebuf = (char *)(pbVar8 + sVar2);
          if (sVar2 == 1) {
            texopt->imfchan = *pbVar8;
          }
        }
        else if (((bVar6 == 0x2d) && ((pbVar8[1] == 0x6d && (pbVar8[2] == 0x6d)))) &&
                ((pbVar8[3] == 0x20 || (pbVar8[3] == 9)))) {
          sVar2 = strspn((char *)(pbVar8 + 4)," \t");
          pbVar8 = pbVar8 + sVar2 + 4;
          sVar2 = strcspn((char *)pbVar8," \t\r");
          pbVar7 = pbVar8 + sVar2;
          local_b0[0] = (undefined1 *)0x0;
          tryParseDouble((char *)pbVar8,(char *)pbVar7,(double *)local_b0);
          texopt->brightness = (float)(double)local_b0[0];
          sVar2 = strspn((char *)pbVar7," \t");
          pbVar7 = pbVar7 + sVar2;
          sVar2 = strcspn((char *)pbVar7," \t\r");
          linebuf = (char *)(pbVar7 + sVar2);
          local_b0[0] = (undefined1 *)0x3ff0000000000000;
          tryParseDouble((char *)pbVar7,linebuf,(double *)local_b0);
          texopt->contrast = (float)(double)local_b0[0];
        }
        else {
          iVar1 = strncmp((char *)pbVar8,"-colorspace",0xb);
          if ((iVar1 == 0) && ((pbVar8[0xb] == 0x20 || (pbVar8[0xb] == 9)))) {
            local_88 = local_78;
            local_80 = 0;
            local_78[0] = 0;
            local_68 = texopt;
            sVar2 = strspn((char *)(pbVar8 + 0xc)," \t");
            pbVar8 = pbVar8 + sVar2 + 0xc;
            sVar2 = strcspn((char *)pbVar8," \t\r");
            linebuf = (char *)(pbVar8 + sVar2);
            local_b0[0] = local_a0;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,pbVar8,linebuf);
            std::__cxx11::string::operator=((string *)&local_88,(string *)local_b0);
            if (local_b0[0] != local_a0) {
              operator_delete(local_b0[0]);
            }
            std::__cxx11::string::operator=(local_60,(string *)&local_88);
            texopt = local_68;
            if (local_88 != local_78) {
              operator_delete(local_88);
              texopt = local_68;
            }
          }
          else {
            std::__cxx11::string::string((string *)local_b0,(char *)pbVar8,(allocator *)&local_88);
            std::__cxx11::string::operator=((string *)&local_50,(string *)local_b0);
            puVar4 = local_a0;
            if (local_b0[0] != puVar4) {
              operator_delete(local_b0[0]);
              puVar4 = extraout_RAX;
            }
            linebuf = (char *)(pbVar8 + local_48);
            local_90 = CONCAT71((int7)((ulong)puVar4 >> 8),1);
          }
        }
      }
    }
    if (((pbVar8[1] == 0x62) && (pbVar8[2] == 0x6d)) && ((pbVar8[3] == 0x20 || (pbVar8[3] == 9)))) {
      sVar2 = strspn((char *)(pbVar8 + 4)," \t");
      pbVar8 = pbVar8 + sVar2 + 4;
      sVar2 = strcspn((char *)pbVar8," \t\r");
      linebuf = (char *)(pbVar8 + sVar2);
      local_b0[0] = (undefined1 *)0x3ff0000000000000;
      tryParseDouble((char *)pbVar8,linebuf,(double *)local_b0);
      texopt->bump_multiplier = (float)(double)local_b0[0];
    }
    else if ((pbVar8[1] == 0x6f) && ((pbVar8[2] == 0x20 || (pbVar8[2] == 9)))) {
      sVar2 = strspn((char *)(pbVar8 + 3)," \t");
      pbVar8 = pbVar8 + sVar2 + 3;
      sVar2 = strcspn((char *)pbVar8," \t\r");
      pbVar7 = pbVar8 + sVar2;
      local_b0[0] = (undefined1 *)0x0;
      tryParseDouble((char *)pbVar8,(char *)pbVar7,(double *)local_b0);
      texopt->origin_offset[0] = (float)(double)local_b0[0];
      sVar2 = strspn((char *)pbVar7," \t");
      pbVar7 = pbVar7 + sVar2;
      sVar2 = strcspn((char *)pbVar7," \t\r");
      pbVar8 = pbVar7 + sVar2;
      local_b0[0] = (undefined1 *)0x0;
      tryParseDouble((char *)pbVar7,(char *)pbVar8,(double *)local_b0);
      texopt->origin_offset[1] = (float)(double)local_b0[0];
      sVar2 = strspn((char *)pbVar8," \t");
      pbVar8 = pbVar8 + sVar2;
      sVar2 = strcspn((char *)pbVar8," \t\r");
      linebuf = (char *)(pbVar8 + sVar2);
      local_b0[0] = (undefined1 *)0x0;
      tryParseDouble((char *)pbVar8,linebuf,(double *)local_b0);
      texopt->origin_offset[2] = (float)(double)local_b0[0];
    }
    else if ((pbVar8[1] == 0x73) && ((pbVar8[2] == 0x20 || (pbVar8[2] == 9)))) {
      sVar2 = strspn((char *)(pbVar8 + 3)," \t");
      pbVar8 = pbVar8 + sVar2 + 3;
      sVar2 = strcspn((char *)pbVar8," \t\r");
      pbVar7 = pbVar8 + sVar2;
      local_b0[0] = (undefined1 *)0x3ff0000000000000;
      tryParseDouble((char *)pbVar8,(char *)pbVar7,(double *)local_b0);
      texopt->scale[0] = (float)(double)local_b0[0];
      sVar2 = strspn((char *)pbVar7," \t");
      pbVar7 = pbVar7 + sVar2;
      sVar2 = strcspn((char *)pbVar7," \t\r");
      pbVar8 = pbVar7 + sVar2;
      local_b0[0] = (undefined1 *)0x3ff0000000000000;
      tryParseDouble((char *)pbVar7,(char *)pbVar8,(double *)local_b0);
      texopt->scale[1] = (float)(double)local_b0[0];
      sVar2 = strspn((char *)pbVar8," \t");
      pbVar8 = pbVar8 + sVar2;
      sVar2 = strcspn((char *)pbVar8," \t\r");
      linebuf = (char *)(pbVar8 + sVar2);
      local_b0[0] = (undefined1 *)0x3ff0000000000000;
      tryParseDouble((char *)pbVar8,linebuf,(double *)local_b0);
      texopt->scale[2] = (float)(double)local_b0[0];
    }
    else {
      if ((pbVar8[1] != 0x74) || ((pbVar8[2] != 0x20 && (pbVar8[2] != 9)))) goto LAB_00108dcc;
      sVar2 = strspn((char *)(pbVar8 + 3)," \t");
      pbVar8 = pbVar8 + sVar2 + 3;
      sVar2 = strcspn((char *)pbVar8," \t\r");
      pbVar7 = pbVar8 + sVar2;
      local_b0[0] = (undefined1 *)0x0;
      tryParseDouble((char *)pbVar8,(char *)pbVar7,(double *)local_b0);
      texopt->turbulence[0] = (float)(double)local_b0[0];
      sVar2 = strspn((char *)pbVar7," \t");
      pbVar7 = pbVar7 + sVar2;
      sVar2 = strcspn((char *)pbVar7," \t\r");
      pbVar8 = pbVar7 + sVar2;
      local_b0[0] = (undefined1 *)0x0;
      tryParseDouble((char *)pbVar7,(char *)pbVar8,(double *)local_b0);
      texopt->turbulence[1] = (float)(double)local_b0[0];
      sVar2 = strspn((char *)pbVar8," \t");
      pbVar8 = pbVar8 + sVar2;
      sVar2 = strcspn((char *)pbVar8," \t\r");
      linebuf = (char *)(pbVar8 + sVar2);
      local_b0[0] = (undefined1 *)0x0;
      tryParseDouble((char *)pbVar8,linebuf,(double *)local_b0);
      texopt->turbulence[2] = (float)(double)local_b0[0];
    }
  } while( true );
}

Assistant:

bool ParseTextureNameAndOption(std::string *texname, texture_option_t *texopt,
                               const char *linebuf) {
  // @todo { write more robust lexer and parser. }
  bool found_texname = false;
  std::string texture_name;

  const char *token = linebuf;  // Assume line ends with NULL

  while (!IS_NEW_LINE((*token))) {
    token += strspn(token, " \t");  // skip space
    if ((0 == strncmp(token, "-blendu", 7)) && IS_SPACE((token[7]))) {
      token += 8;
      texopt->blendu = parseOnOff(&token, /* default */ true);
    } else if ((0 == strncmp(token, "-blendv", 7)) && IS_SPACE((token[7]))) {
      token += 8;
      texopt->blendv = parseOnOff(&token, /* default */ true);
    } else if ((0 == strncmp(token, "-clamp", 6)) && IS_SPACE((token[6]))) {
      token += 7;
      texopt->clamp = parseOnOff(&token, /* default */ true);
    } else if ((0 == strncmp(token, "-boost", 6)) && IS_SPACE((token[6]))) {
      token += 7;
      texopt->sharpness = parseReal(&token, 1.0);
    } else if ((0 == strncmp(token, "-bm", 3)) && IS_SPACE((token[3]))) {
      token += 4;
      texopt->bump_multiplier = parseReal(&token, 1.0);
    } else if ((0 == strncmp(token, "-o", 2)) && IS_SPACE((token[2]))) {
      token += 3;
      parseReal3(&(texopt->origin_offset[0]), &(texopt->origin_offset[1]),
                 &(texopt->origin_offset[2]), &token);
    } else if ((0 == strncmp(token, "-s", 2)) && IS_SPACE((token[2]))) {
      token += 3;
      parseReal3(&(texopt->scale[0]), &(texopt->scale[1]), &(texopt->scale[2]),
                 &token, 1.0, 1.0, 1.0);
    } else if ((0 == strncmp(token, "-t", 2)) && IS_SPACE((token[2]))) {
      token += 3;
      parseReal3(&(texopt->turbulence[0]), &(texopt->turbulence[1]),
                 &(texopt->turbulence[2]), &token);
    } else if ((0 == strncmp(token, "-type", 5)) && IS_SPACE((token[5]))) {
      token += 5;
      texopt->type = parseTextureType((&token), TEXTURE_TYPE_NONE);
    } else if ((0 == strncmp(token, "-imfchan", 8)) && IS_SPACE((token[8]))) {
      token += 9;
      token += strspn(token, " \t");
      const char *end = token + strcspn(token, " \t\r");
      if ((end - token) == 1) {  // Assume one char for -imfchan
        texopt->imfchan = (*token);
      }
      token = end;
    } else if ((0 == strncmp(token, "-mm", 3)) && IS_SPACE((token[3]))) {
      token += 4;
      parseReal2(&(texopt->brightness), &(texopt->contrast), &token, 0.0, 1.0);
    } else if ((0 == strncmp(token, "-colorspace", 11)) &&
               IS_SPACE((token[11]))) {
      token += 12;
      texopt->colorspace = parseString(&token);
    } else {
// Assume texture filename
#if 0
      size_t len = strcspn(token, " \t\r");  // untile next space
      texture_name = std::string(token, token + len);
      token += len;

      token += strspn(token, " \t");  // skip space
#else
      // Read filename until line end to parse filename containing whitespace
      // TODO(syoyo): Support parsing texture option flag after the filename.
      texture_name = std::string(token);
      token += texture_name.length();
#endif

      found_texname = true;
    }
  }

  if (found_texname) {
    (*texname) = texture_name;
    return true;
  } else {
    return false;
  }
}